

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

int __thiscall crnd::prefix_coding::decoder_tables::init(decoder_tables *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ushort uVar2;
  uint32 i;
  uint uVar3;
  ulong uVar4;
  unsigned_short *puVar5;
  uint *__s;
  byte bVar6;
  uint in_ECX;
  ulong uVar7;
  uint uVar8;
  long in_RDX;
  long lVar9;
  uint32 uVar10;
  uint32 uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint32 j;
  uint32 i_2;
  uint32 num_codes [17];
  int aiStack_c4 [3];
  uint32 min_codes [16];
  uint32 sorted_positions [17];
  uint uStack_34;
  
  uVar8 = (uint)ctx;
  if (in_ECX < 0xc && uVar8 != 0) {
    this->m_num_syms = uVar8;
    num_codes[0xc] = 0;
    num_codes[0xd] = 0;
    num_codes[0xe] = 0;
    num_codes[0xf] = 0;
    num_codes[8] = 0;
    num_codes[9] = 0;
    num_codes[10] = 0;
    num_codes[0xb] = 0;
    num_codes[0x10] = 0;
    num_codes[4] = 0;
    num_codes[5] = 0;
    num_codes[6] = 0;
    num_codes[7] = 0;
    num_codes[0] = 0;
    num_codes[1] = 0;
    num_codes[2] = 0;
    num_codes[3] = 0;
    for (uVar4 = 0; ((ulong)ctx & 0xffffffff) != uVar4; uVar4 = uVar4 + 1) {
      if ((ulong)*(byte *)(in_RDX + uVar4) != 0) {
        num_codes[*(byte *)(in_RDX + uVar4)] = num_codes[*(byte *)(in_RDX + uVar4)] + 1;
      }
    }
    uVar14 = 0;
    bVar6 = 0xf;
    uVar3 = 0xffffffff;
    uVar11 = 0;
    uVar10 = 0;
    for (lVar9 = -0x10; lVar9 != 0; lVar9 = lVar9 + 1) {
      iVar12 = aiStack_c4[lVar9];
      if (iVar12 == 0) {
        this->m_max_codes[lVar9 + 0x10] = 0;
      }
      else {
        uVar13 = (int)lVar9 + 0x11;
        if (uVar13 <= uVar3) {
          uVar3 = uVar13;
        }
        if (uVar14 <= uVar13) {
          uVar14 = uVar13;
        }
        iVar1 = iVar12 + uVar10;
        sorted_positions[lVar9] = uVar10;
        uVar10 = uVar10 + iVar12;
        this->m_max_codes[lVar9 + 0x10] =
             (~(-1 << (bVar6 & 0x1f)) | iVar1 + -1 << (bVar6 & 0x1f)) + 1;
        this->m_val_ptrs[lVar9 + 0x10] = uVar11;
        (&uStack_34)[lVar9] = uVar11;
        uVar11 = iVar12 + uVar11;
      }
      uVar10 = uVar10 * 2;
      bVar6 = bVar6 - 1;
    }
    this->m_total_used_syms = uVar11;
    if (this->m_cur_sorted_symbol_order_size < uVar11) {
      this->m_cur_sorted_symbol_order_size = uVar11;
      if ((uVar11 & uVar11 - 1) != 0) {
        uVar11 = math::next_pow2(uVar11);
        if (uVar8 < uVar11) {
          uVar11 = uVar8;
        }
        this->m_cur_sorted_symbol_order_size = uVar11;
      }
      if (this->m_sorted_symbol_order != (uint16 *)0x0) {
        crnd_free(this->m_sorted_symbol_order + -4);
        uVar11 = this->m_cur_sorted_symbol_order_size;
      }
      puVar5 = crnd_new_array<unsigned_short>(uVar11);
      this->m_sorted_symbol_order = puVar5;
      if (puVar5 == (unsigned_short *)0x0) goto LAB_0010fc84;
    }
    this->m_min_code_size = (uint8)uVar3;
    this->m_max_code_size = (uint8)uVar14;
    for (uVar4 = 0; ((ulong)ctx & 0xffffffff) != uVar4; uVar4 = uVar4 + 1) {
      uVar7 = (ulong)*(byte *)(in_RDX + uVar4);
      if (uVar7 != 0) {
        uVar8 = sorted_positions[uVar7];
        sorted_positions[uVar7] = uVar8 + 1;
        this->m_sorted_symbol_order[uVar8] = (uint16)uVar4;
      }
    }
    uVar3 = (uint)this->m_min_code_size;
    uVar8 = 0;
    if (uVar3 < in_ECX) {
      uVar8 = in_ECX;
    }
    this->m_table_bits = uVar8;
    if (uVar3 < in_ECX) {
      uVar11 = 1 << ((byte)in_ECX & 0x1f);
      if (this->m_cur_lookup_size < uVar11) {
        this->m_cur_lookup_size = uVar11;
        if (this->m_lookup != (uint32 *)0x0) {
          crnd_free(this->m_lookup + -2);
        }
        __s = crnd_new_array<unsigned_int>(uVar11);
        this->m_lookup = __s;
        if (__s == (uint *)0x0) goto LAB_0010fc84;
      }
      else {
        __s = this->m_lookup;
      }
      memset(__s,0xff,4L << ((byte)in_ECX & 0x3f));
      for (uVar4 = 1; uVar4 != in_ECX + 1; uVar4 = uVar4 + 1) {
        if (num_codes[uVar4] != 0) {
          uVar11 = min_codes[uVar4 - 1];
          uVar10 = this->m_max_codes[uVar4 - 1];
          iVar12 = this->m_max_codes[uVar4 + 0x10] - uVar11;
          bVar6 = (char)uVar8 - (char)uVar4;
          for (; (uVar10 == 0 || (uVar11 <= uVar10 - 1 >> (0x10U - (char)uVar4 & 0x1f)));
              uVar11 = uVar11 + 1) {
            uVar2 = this->m_sorted_symbol_order[iVar12 + uVar11];
            for (uVar13 = 0; uVar13 >> (bVar6 & 0x1f) == 0; uVar13 = uVar13 + 1) {
              this->m_lookup[(uVar11 << (bVar6 & 0x1f)) + uVar13] = (uint)uVar2 | (int)uVar4 << 0x10
              ;
            }
          }
        }
      }
    }
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      this->m_val_ptrs[lVar9] = this->m_val_ptrs[lVar9] - min_codes[lVar9];
    }
    this->m_table_max_code = 0;
    this->m_decode_start_code_size = (uint)this->m_min_code_size;
    if (uVar3 < in_ECX) {
      do {
        uVar3 = in_ECX - 1;
        if (in_ECX == 0) goto LAB_0010ff5c;
        uVar4 = (ulong)in_ECX;
        in_ECX = uVar3;
      } while (num_codes[uVar4] == 0);
      this->m_table_max_code = this->m_max_codes[uVar3];
      uVar8 = uVar8 + 1;
      this->m_decode_start_code_size = uVar8;
      for (; uVar8 <= uVar14; uVar8 = uVar8 + 1) {
        if (num_codes[uVar8] != 0) {
          this->m_decode_start_code_size = uVar8;
          break;
        }
      }
    }
LAB_0010ff5c:
    this->m_max_codes[0x10] = 0xffffffff;
    this->m_val_ptrs[0x10] = 0xfffff;
    uVar11 = 0x20 - this->m_table_bits;
    this->m_table_shift = uVar11;
    iVar12 = (int)CONCAT71((uint7)(uint3)(uVar11 >> 8),1);
  }
  else {
LAB_0010fc84:
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

bool decoder_tables::init(uint32 num_syms, const uint8* pCodesizes, uint32 table_bits) {
  uint32 min_codes[cMaxExpectedCodeSize];
  if ((!num_syms) || (table_bits > cMaxTableBits))
    return false;

  m_num_syms = num_syms;

  uint32 num_codes[cMaxExpectedCodeSize + 1];
  utils::zero_object(num_codes);

  for (uint32 i = 0; i < num_syms; i++) {
    uint32 c = pCodesizes[i];
    if (c)
      num_codes[c]++;
  }

  uint32 sorted_positions[cMaxExpectedCodeSize + 1];

  uint32 cur_code = 0;

  uint32 total_used_syms = 0;
  uint32 max_code_size = 0;
  uint32 min_code_size = cUINT32_MAX;
  for (uint32 i = 1; i <= cMaxExpectedCodeSize; i++) {
    const uint32 n = num_codes[i];

    if (!n)
      m_max_codes[i - 1] = 0;  //UINT_MAX;
    else {
      min_code_size = math::minimum(min_code_size, i);
      max_code_size = math::maximum(max_code_size, i);

      min_codes[i - 1] = cur_code;

      m_max_codes[i - 1] = cur_code + n - 1;
      m_max_codes[i - 1] = 1 + ((m_max_codes[i - 1] << (16 - i)) | ((1 << (16 - i)) - 1));

      m_val_ptrs[i - 1] = total_used_syms;

      sorted_positions[i] = total_used_syms;

      cur_code += n;
      total_used_syms += n;
    }

    cur_code <<= 1;
  }

  m_total_used_syms = total_used_syms;

  if (total_used_syms > m_cur_sorted_symbol_order_size) {
    m_cur_sorted_symbol_order_size = total_used_syms;

    if (!math::is_power_of_2(total_used_syms))
      m_cur_sorted_symbol_order_size = math::minimum<uint32>(num_syms, math::next_pow2(total_used_syms));

    if (m_sorted_symbol_order)
      crnd_delete_array(m_sorted_symbol_order);

    m_sorted_symbol_order = crnd_new_array<uint16>(m_cur_sorted_symbol_order_size);
    if (!m_sorted_symbol_order)
      return false;
  }

  m_min_code_size = static_cast<uint8>(min_code_size);
  m_max_code_size = static_cast<uint8>(max_code_size);

  for (uint32 i = 0; i < num_syms; i++) {
    uint32 c = pCodesizes[i];
    if (c) {
      CRND_ASSERT(num_codes[c]);

      uint32 sorted_pos = sorted_positions[c]++;

      CRND_ASSERT(sorted_pos < total_used_syms);

      m_sorted_symbol_order[sorted_pos] = static_cast<uint16>(i);
    }
  }

  if (table_bits <= m_min_code_size)
    table_bits = 0;
  m_table_bits = table_bits;

  if (table_bits) {
    uint32 table_size = 1 << table_bits;
    if (table_size > m_cur_lookup_size) {
      m_cur_lookup_size = table_size;

      if (m_lookup)
        crnd_delete_array(m_lookup);

      m_lookup = crnd_new_array<uint32>(table_size);
      if (!m_lookup)
        return false;
    }

    memset(m_lookup, 0xFF, (uint)sizeof(m_lookup[0]) * (1UL << table_bits));

    for (uint32 codesize = 1; codesize <= table_bits; codesize++) {
      if (!num_codes[codesize])
        continue;

      const uint32 fillsize = table_bits - codesize;
      const uint32 fillnum = 1 << fillsize;

      const uint32 min_code = min_codes[codesize - 1];
      const uint32 max_code = get_unshifted_max_code(codesize);
      const uint32 val_ptr = m_val_ptrs[codesize - 1];

      for (uint32 code = min_code; code <= max_code; code++) {
        const uint32 sym_index = m_sorted_symbol_order[val_ptr + code - min_code];
        CRND_ASSERT(pCodesizes[sym_index] == codesize);

        for (uint32 j = 0; j < fillnum; j++) {
          const uint32 t = j + (code << fillsize);

          CRND_ASSERT(t < (1U << table_bits));

          CRND_ASSERT(m_lookup[t] == cUINT32_MAX);

          m_lookup[t] = sym_index | (codesize << 16U);
        }
      }
    }
  }

  for (uint32 i = 0; i < cMaxExpectedCodeSize; i++)
    m_val_ptrs[i] -= min_codes[i];

  m_table_max_code = 0;
  m_decode_start_code_size = m_min_code_size;

  if (table_bits) {
    uint32 i;
    for (i = table_bits; i >= 1; i--) {
      if (num_codes[i]) {
        m_table_max_code = m_max_codes[i - 1];
        break;
      }
    }
    if (i >= 1) {
      m_decode_start_code_size = table_bits + 1;
      for (uint32 j = table_bits + 1; j <= max_code_size; j++) {
        if (num_codes[j]) {
          m_decode_start_code_size = j;
          break;
        }
      }
    }
  }

  // sentinels
  m_max_codes[cMaxExpectedCodeSize] = cUINT32_MAX;
  m_val_ptrs[cMaxExpectedCodeSize] = 0xFFFFF;

  m_table_shift = 32 - m_table_bits;
  return true;
}